

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualStringLen
               (char *expected,char *actual,_UU32 length,char *msg,_U_UINT lineNumber)

{
  bool bVar1;
  uint local_34;
  _UU32 i;
  _U_UINT lineNumber_local;
  char *msg_local;
  _UU32 length_local;
  char *actual_local;
  char *expected_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if ((expected == (char *)0x0) || (actual == (char *)0x0)) {
      if (expected != actual) {
        Unity.CurrentTestFailed = 1;
      }
    }
    else {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if ((local_34 < length) && (bVar1 = true, expected[local_34] == '\0')) {
          bVar1 = actual[local_34] != '\0';
        }
        if (!bVar1) goto LAB_00104ca3;
        if (expected[local_34] != actual[local_34]) break;
        local_34 = local_34 + 1;
      }
      Unity.CurrentTestFailed = 1;
    }
LAB_00104ca3:
    if (Unity.CurrentTestFailed != 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrintExpectedAndActualStringsLen(expected,actual,length);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualStringLen(const char* expected,
                            const char* actual,
                            const _UU32 length,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber)
{
    _UU32 i;

    UNITY_SKIP_EXECUTION;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; (i < length) && (expected[i] || actual[i]); i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrintExpectedAndActualStringsLen(expected, actual, length);
      UnityAddMsgIfSpecified(msg);
      UNITY_FAIL_AND_BAIL;
    }
}